

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

DetectorResult *
ZXing::QRCode::SampleMQR
          (DetectorResult *__return_storage_ptr__,BitMatrix *image,ConcentricPattern *fp)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PerspectiveTransform *pPVar5;
  PerspectiveTransform *pPVar6;
  undefined8 in_R8;
  int i_1;
  long lVar7;
  int i;
  uint uVar8;
  uint32_t formatInfoBits;
  uint uVar9;
  byte bVar10;
  PointF PVar11;
  PointF PVar12;
  FormatInformation FVar13;
  undefined1 local_288 [64];
  anon_class_24_3_8006d00c check;
  PerspectiveTransform bestPT;
  BitMatrixCursor<ZXing::PointT<double>_> local_1c0;
  QuadrilateralF local_198;
  optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> fpQuad;
  PointI FORMAT_INFO_COORDS [17];
  PerspectiveTransform mod2Pix;
  PointF p;
  
  bVar10 = 0;
  FindConcentricPatternCorners(&fpQuad,image,fp->super_PointF,fp->size,2);
  if (fpQuad.super__Optional_base<ZXing::Quadrilateral<ZXing::PointT<double>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<ZXing::Quadrilateral<ZXing::PointT<double>_>_>.
      _M_engaged != false) {
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = 6.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = 0.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = 6.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = 6.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = 0.5;
    local_198.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = 6.5;
    memcpy(FORMAT_INFO_COORDS,&DAT_001a9430,0x88);
    bestPT.a33 = NAN;
    local_1c0.p.x = 0.0;
    local_1c0.p.y = 0.0;
    local_1c0.d.x = NAN;
    local_1c0.d.y = NAN;
    local_288._8_8_ = 0x400000000;
    local_288._0_8_ = 0xffffff00000000;
    local_1c0.img = image;
    for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
      RotatedCorners<ZXing::PointT<double>>
                ((Quadrilateral<ZXing::PointT<double>_> *)&check,(ZXing *)&fpQuad,
                 (Quadrilateral<ZXing::PointT<double>_> *)(ulong)uVar8,0,SUB81(in_R8,0));
      PerspectiveTransform::PerspectiveTransform(&mod2Pix,&local_198,(QuadrilateralF *)&check);
      check.FORMAT_INFO_COORDS = &FORMAT_INFO_COORDS;
      check.mod2Pix = &mod2Pix;
      check.image = image;
      bVar2 = SampleMQR::anon_class_24_3_8006d00c::operator()(&check,0,true);
      if (((bVar2) &&
          (bVar2 = SampleMQR::anon_class_24_3_8006d00c::operator()(&check,8,false), bVar2)) &&
         (bVar2 = SampleMQR::anon_class_24_3_8006d00c::operator()(&check,0x10,true), bVar2)) {
        formatInfoBits = 0;
        for (lVar7 = 1; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          PVar11.y = (double)FORMAT_INFO_COORDS[lVar7].y + 0.5;
          PVar11.x = (double)FORMAT_INFO_COORDS[lVar7].x + 0.5;
          PVar11 = PerspectiveTransform::operator()(&mod2Pix,PVar11);
          bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&local_1c0,PVar11);
          formatInfoBits = (uint)bVar2 + formatInfoBits * 2;
        }
        FVar13 = FormatInformation::DecodeMQR(formatInfoBits);
        if ((FVar13._4_4_ >> 8 & 0xff) < (local_288._4_4_ >> 8 & 0xff)) {
          pPVar5 = &mod2Pix;
          pPVar6 = &bestPT;
          for (lVar7 = 9; local_288._0_16_ = (undefined1  [16])FVar13, lVar7 != 0;
              lVar7 = lVar7 + -1) {
            pPVar6->a11 = pPVar5->a11;
            pPVar5 = (PerspectiveTransform *)((long)pPVar5 + (ulong)bVar10 * -0x10 + 8);
            pPVar6 = (PerspectiveTransform *)((long)pPVar6 + (ulong)bVar10 * -0x10 + 8);
          }
        }
      }
    }
    if ((local_288._0_16_ & (undefined1  [16])0xfc0000000000) == (undefined1  [16])0x0) {
      bVar10 = local_288[9];
      uVar4 = 0;
      uVar8 = bVar10 + 9 + (uint)bVar10;
      if (3 < bVar10 - 1) {
        uVar8 = uVar4;
      }
      local_288._0_8_ = (double)uVar8 + 0.5;
      dVar1 = 0.0;
      uVar9 = uVar8;
      while (bVar2 = uVar9 != 0, uVar9 = uVar9 - 1, bVar2) {
        local_288._8_8_ = dVar1;
        PVar12.y = (double)local_288._0_8_;
        PVar12.x = dVar1 + 0.5;
        PVar11 = PerspectiveTransform::operator()(&bestPT,PVar12);
        p.y = dVar1 + 0.5;
        p.x = (double)local_288._0_8_;
        PVar12 = PerspectiveTransform::operator()(&bestPT,p);
        bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&local_1c0,PVar11);
        uVar3 = 0;
        if (bVar2) {
          bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt(&local_1c0,PVar12);
          uVar3 = (uint)bVar2;
        }
        uVar4 = uVar4 + uVar3;
        dVar1 = dVar1 + 1.0;
      }
      if (uVar4 <= (uVar8 * 2) / 3) {
        SampleGrid(__return_storage_ptr__,image,uVar8,uVar8,&bestPT);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_bits)._width = 0;
  (__return_storage_ptr__->_bits)._height = 0;
  (__return_storage_ptr__->_bits)._bits.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

DetectorResult SampleMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

#if defined(_MSVC_LANG) // TODO: see MSVC issue https://developercommunity.visualstudio.com/t/constexpr-object-is-unable-to-be-used-as/10035065
	static
#else
	constexpr
#endif
		const PointI FORMAT_INFO_COORDS[] = {{0, 8}, {1, 8}, {2, 8}, {3, 8}, {4, 8}, {5, 8}, {6, 8}, {7, 8}, {8, 8},
											 {8, 7}, {8, 6}, {8, 5}, {8, 4}, {8, 3}, {8, 2}, {8, 1}, {8, 0}};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool checkOne) {
			auto p = mod2Pix(centered(FORMAT_INFO_COORDS[i]));
			return image.isIn(p) && (!checkOne || image.get(p));
		};

		// check that we see both innermost timing pattern modules
		if (!check(0, true) || !check(8, false) || !check(16, true))
			continue;

		int formatInfoBits = 0;
		for (int i = 1; i <= 15; ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeMQR(formatInfoBits);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const int dim = Version::SymbolSize(bestFI.microVersion, Type::Micro).x;

	// check that we are in fact not looking at a corner of a non-micro QRCode symbol
	// we accept at most 1/3rd black pixels in the quite zone (in a QRCode symbol we expect about 1/2).
	int blackPixels = 0;
	for (int i = 0; i < dim; ++i) {
		auto px = bestPT(centered(PointI{i, dim}));
		auto py = bestPT(centered(PointI{dim, i}));
		blackPixels += cur.blackAt(px) && cur.blackAt(py);
	}
	if (blackPixels > 2 * dim / 3)
		return {};

	return SampleGrid(image, dim, dim, bestPT);
}

DetectorResult SampleRMQR(const BitMatrix& image, const ConcentricPattern& fp)
{
	auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2);
	if (!fpQuad)
		return {};

	auto srcQuad = Rectangle(7, 7, 0.5);

	static const PointI FORMAT_INFO_EDGE_COORDS[] = {{8, 0}, {9, 0}, {10, 0}, {11, 0}};
	static const PointI FORMAT_INFO_COORDS[] = {
		{11, 3}, {11, 2}, {11, 1},
		{10, 5}, {10, 4}, {10, 3}, {10, 2}, {10, 1},
		{ 9, 5}, { 9, 4}, { 9, 3}, { 9, 2}, { 9, 1},
		{ 8, 5}, { 8, 4}, { 8, 3}, { 8, 2}, { 8, 1},
	};

	FormatInformation bestFI;
	PerspectiveTransform bestPT;
	BitMatrixCursorF cur(image, {}, {});

	for (int i = 0; i < 4; ++i) {
		auto mod2Pix = PerspectiveTransform(srcQuad, RotatedCorners(*fpQuad, i));

		auto check = [&](int i, bool on) {
			return cur.testAt(mod2Pix(centered(FORMAT_INFO_EDGE_COORDS[i]))) == BitMatrixCursorF::Value(on);
		};

		// check that we see top edge timing pattern modules
		if (!check(0, true) || !check(1, false) || !check(2, true) || !check(3, false))
			continue;

		uint32_t formatInfoBits = 0;
		for (int i = 0; i < Size(FORMAT_INFO_COORDS); ++i)
			AppendBit(formatInfoBits, cur.blackAt(mod2Pix(centered(FORMAT_INFO_COORDS[i]))));

		auto fi = FormatInformation::DecodeRMQR(formatInfoBits, 0 /*formatInfoBits2*/);
		if (fi.hammingDistance < bestFI.hammingDistance) {
			bestFI = fi;
			bestPT = mod2Pix;
		}
	}

	if (!bestFI.isValid())
		return {};

	const PointI dim = Version::SymbolSize(bestFI.microVersion, Type::rMQR);

	// TODO: this is a WIP
	auto intersectQuads = [](QuadrilateralF& a, QuadrilateralF& b) {
		auto tl = Center(a);
		auto br = Center(b);
		// rotate points such that topLeft of a is furthest away from b and topLeft of b is closest to a
		auto dist2B = [c = br](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetA = narrow_cast<int>(std::max_element(a.begin(), a.end(), dist2B) - a.begin());
		auto dist2A = [c = tl](auto a, auto b) { return distance(a, c) < distance(b, c); };
		auto offsetB = narrow_cast<int>(std::min_element(b.begin(), b.end(), dist2A) - b.begin());

		a = RotatedCorners(a, offsetA);
		b = RotatedCorners(b, offsetB);

		auto tr = (intersect(RegressionLine(a[0], a[1]), RegressionLine(b[1], b[2]))
				   + intersect(RegressionLine(a[3], a[2]), RegressionLine(b[0], b[3])))
				  / 2;
		auto bl = (intersect(RegressionLine(a[0], a[3]), RegressionLine(b[2], b[3]))
				   + intersect(RegressionLine(a[1], a[2]), RegressionLine(b[0], b[1])))
				  / 2;

		log(tr, 2);
		log(bl, 2);

		return QuadrilateralF{tl, tr, br, bl};
	};

	if (auto found = LocateAlignmentPattern(image, fp.size / 7, bestPT(dim - PointF(3, 3)))) {
		log(*found, 2);
		if (auto spQuad = FindConcentricPatternCorners(image, *found, fp.size / 2, 1)) {
			auto dest = intersectQuads(*fpQuad, *spQuad);
			if (dim.y <= 9) {
				bestPT = PerspectiveTransform({{6.5, 0.5}, {dim.x - 1.5, dim.y - 3.5}, {dim.x - 1.5, dim.y - 1.5}, {6.5, 6.5}},
											  {fpQuad->topRight(), spQuad->topRight(), spQuad->bottomRight(), fpQuad->bottomRight()});
			} else {
				dest[0] = fp;
				dest[2] = *found;
				bestPT = PerspectiveTransform({{3.5, 3.5}, {dim.x - 2.5, 3.5}, {dim.x - 2.5, dim.y - 2.5}, {3.5, dim.y - 2.5}}, dest);
			}
		}
	}

	return SampleGrid(image, dim.x, dim.y, bestPT);
}

}